

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O3

FT_Pointer ft_mem_dup(FT_Memory memory,void *address,FT_ULong size,FT_Error *p_error)

{
  void *__dest;
  int iVar1;
  
  if ((long)size < 1) {
    __dest = (void *)0x0;
    iVar1 = 6;
    if (size == 0) {
      iVar1 = 0;
    }
  }
  else {
    __dest = (*memory->alloc)(memory,size);
    iVar1 = (uint)(__dest == (void *)0x0) << 6;
  }
  if ((address != (void *)0x0) && (iVar1 == 0)) {
    memcpy(__dest,address,size);
  }
  *p_error = iVar1;
  return __dest;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_dup( FT_Memory    memory,
              const void*  address,
              FT_ULong     size,
              FT_Error    *p_error )
  {
    FT_Error    error;
    FT_Pointer  p = ft_mem_qalloc( memory, (FT_Long)size, &error );


    if ( !error && address )
      ft_memcpy( p, address, size );

    *p_error = error;
    return p;
  }